

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O3

void test_dynamichistogram_disabled(void)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  stringstream msg;
  DynamicHistogram<double> histogramDisabled;
  DynamicHistogramOptions options;
  string local_2a0 [32];
  stringstream local_280 [16];
  long local_270 [47];
  DynamicHistogram<double> local_f8;
  DynamicHistogramOptions local_24;
  
  local_24.binCount = 100;
  local_24.cacheSize = 1000;
  local_24.enabled = false;
  DynamicHistogram<double>::DynamicHistogram(&local_f8,&local_24);
  bVar1 = DynamicHistogram<double>::add(&local_f8,1.0);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_270,"DynamicHistogram::add failed on disabled histogram",0x32);
    cVar2 = std::ios::widen((ios *)((ostream *)local_270 + *(long *)(local_270[0] + -0x18)),'\n');
    poVar3 = (ostream *)std::ostream::put((ostream *)local_270,cVar2);
    std::ostream::flush(poVar3);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,local_2a0);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  DynamicHistogram<double>::bin(&local_f8,0);
  std::__cxx11::stringstream::stringstream(local_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_270,"DynamicHistogram::bin failed on disabled histogram",0x32);
  cVar2 = std::ios::widen((ios *)((ostream *)local_270 + *(long *)(local_270[0] + -0x18)),'\n');
  poVar3 = (ostream *)std::ostream::put((ostream *)local_270,cVar2);
  std::ostream::flush(poVar3);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,local_2a0);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_dynamichistogram_disabled()
{

    DynamicHistogramOptions options(false);
    DynamicHistogram<double> histogramDisabled(options);
    ASSERT(!histogramDisabled.add(1), "DynamicHistogram::add failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.bin(0), "DynamicHistogram::bin failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.cdf(), "DynamicHistogram::cdf failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.contains(0), "DynamicHistogram::contains failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.count(), "DynamicHistogram::count failed on disabled histogram");
    ASSERT(!histogramDisabled.enabled(), "DynamicHistogram::enabled failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.frequency(0), "DynamicHistogram::frequency failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.frequencies(), "DynamicHistogram::frequencies failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.index(0), "DynamicHistogram::index failed on disabled histogram");
    ASSERT(!histogramDisabled.initialized(), "DynamicHistogram::initialized failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.max(), "DynamicHistogram::max failed on disabled histogram");
    ASSERT_EQUAL(histogramDisabled.merges(), 0, "DynamicHistogram::merges failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.min(), "DynamicHistogram::min failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.order(0), "DynamicHistogram::order failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.pdf(), "DynamicHistogram::pdf failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.total(), "DynamicHistogram::total failed on disabled histogram");
    ASSERT_EXCEPTION(histogramDisabled.width(0), "DynamicHistogram::width failed on disabled histogram");

}